

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags,
                     ImGuiWindow *docked_window)

{
  ImGuiItemStatusFlags *pIVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ImGuiDockNode *pIVar6;
  bool bVar7;
  bool bVar8;
  ImGuiContext_conflict1 *ctx;
  ImGuiWindow *pIVar9;
  ImGuiWindow_conflict *pIVar10;
  char *pcVar11;
  _Bool _Var12;
  bool bVar13;
  ImU32 id;
  uint flags_00;
  int iVar14;
  int iVar15;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar16;
  ImGuiTabItem *pIVar17;
  size_t sVar18;
  undefined8 extraout_RAX;
  char *pcVar19;
  ImGuiCol idx;
  int iVar20;
  uint uVar21;
  bool is_contents_visible;
  float fVar22;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar23;
  ImVec2 IVar24;
  ImVec2 IVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  bool text_clipped;
  bool just_closed;
  ImDrawList *local_d8;
  undefined4 local_d0;
  uint local_cc;
  ImGuiWindow *local_c8;
  bool held;
  float local_bc;
  ImVec2 local_b8;
  ImGuiWindow_conflict *local_b0;
  undefined1 local_a8 [24];
  bool hovered;
  float fStack_8c;
  bool *local_88;
  char *local_80;
  ImRect bb;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  ctx = GImGui;
  local_b0 = GImGui->CurrentWindow;
  if (local_b0->SkipItems != false) {
    return false;
  }
  local_c8 = docked_window;
  id = TabBarCalcTabID(tab_bar,label,docked_window);
  if (p_open != (bool *)0x0) {
    if (*p_open == false) {
      bb.Min.x = 0.0;
      bb.Min.y = 0.0;
      bb.Max.x = 0.0;
      bb.Max.y = 0.0;
      ItemAdd(&bb,id,(ImRect *)0x0,0x18);
      return false;
    }
    if (((uint)flags >> 0x15 & 1) != 0) {
      __assert_fail("!p_open || !(flags & ImGuiTabItemFlags_Button)",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                    ,0x1f0c,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                   );
    }
  }
  if ((~flags & 0xc0U) == 0) {
    __assert_fail("(flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0x1f0d,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                 );
  }
  local_88 = (bool *)0x0;
  flags_00 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_88 = p_open;
    flags_00 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    flags_00 = flags;
  }
  IVar24 = TabItemCalcSize(label,local_88 != (bool *)0x0);
  local_a8._8_4_ = extraout_XMM0_Dc;
  local_a8._0_4_ = IVar24.x;
  local_a8._4_4_ = IVar24.y;
  local_a8._12_4_ = extraout_XMM0_Dd;
  pIVar16 = TabBarFindTabByID(tab_bar,id);
  pIVar17 = pIVar16;
  local_80 = label;
  if (pIVar16 == (ImGuiTabItem *)0x0) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,(ImGuiTabItem *)&bb);
    pIVar17 = ImVector<ImGuiTabItem>::back(&tab_bar->Tabs);
    pIVar17->ID = id;
    pIVar17->Width = (float)local_a8._0_4_;
    tab_bar->TabsAddedNew = true;
  }
  iVar14 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar17);
  pcVar11 = local_80;
  tab_bar->LastTabItemIdx = (ImS16)iVar14;
  pIVar17->ContentWidth = (float)local_a8._0_4_;
  sVar2 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar2 + 1;
  pIVar17->BeginOrder = sVar2;
  uVar21 = tab_bar->Flags;
  iVar14 = tab_bar->PrevFrameVisible;
  iVar3 = ctx->FrameCount;
  iVar20 = pIVar17->LastFrameVisible;
  pIVar17->LastFrameVisible = iVar3;
  pIVar17->Flags = flags_00;
  pIVar17->Window = local_c8;
  if (local_c8 == (ImGuiWindow *)0x0) {
    local_b8 = (ImVec2)&tab_bar->TabsNames;
    iVar4 = (tab_bar->TabsNames).Buf.Size;
    iVar15 = iVar4 + -1;
    if (iVar4 == 0) {
      iVar15 = 0;
    }
    pIVar17->NameOffset = iVar15;
    local_d8 = (ImDrawList *)CONCAT44(local_d8._4_4_,iVar20);
    local_cc = uVar21;
    sVar18 = strlen(local_80);
    ImGuiTextBuffer::append((ImGuiTextBuffer *)local_b8,pcVar11,pcVar11 + sVar18 + 1);
    uVar21 = local_cc;
    iVar20 = (int)local_d8._0_4_;
  }
  else {
    if ((uVar21 >> 0x14 & 1) == 0) {
      __assert_fail("tab_bar->Flags & ImGuiTabBarFlags_DockNode",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                    ,0x1f34,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                   );
    }
    pIVar17->NameOffset = -1;
  }
  iVar14 = iVar14 + 1;
  iVar20 = iVar20 + 1;
  if (((iVar20 < iVar3) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if (iVar14 < iVar3) {
      if ((flags_00 & 0x200000) == 0 && tab_bar->SelectedTabId == 0) {
LAB_0021322e:
        tab_bar->NextSelectedTabId = id;
      }
    }
    else if ((flags_00 >> 0x15 & 1) == 0) goto LAB_0021322e;
  }
  if ((((flags_00 & 2) != 0) && (tab_bar->SelectedTabId != id)) && ((flags_00 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    is_contents_visible = true;
  }
  else {
    is_contents_visible = false;
    if (((tab_bar->SelectedTabId == 0) &&
        (is_contents_visible = false, local_c8 == (ImGuiWindow *)0x0)) && (iVar14 < iVar3)) {
      if ((tab_bar->Tabs).Size == 1) {
        is_contents_visible = (tab_bar->Flags & 2) == 0;
      }
      else {
        is_contents_visible = false;
      }
    }
  }
  if ((iVar20 < iVar3) && (pIVar16 == (ImGuiTabItem *)0x0 || iVar3 <= iVar14)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0,0x18);
    return (bool)((flags_00 >> 0x15 & 1) == 0 & is_contents_visible);
  }
  if (tab_bar->SelectedTabId == id) {
    pIVar17->LastFrameSelected = ctx->FrameCount;
  }
  uVar5 = pIVar17->Flags;
  fVar28 = pIVar17->Width;
  fVar22 = pIVar17->Offset;
  if ((uVar5 & 0xc0) == 0) {
    fVar22 = (float)(int)(fVar22 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar22 + (tab_bar->BarRect).Min.x;
  local_b8 = (local_b0->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar24.y = bb.Min.y;
  IVar24.x = bb.Min.x;
  (local_b0->DC).CursorPos = IVar24;
  bb.Max.x = fVar28 + bb.Min.x;
  bb.Max.y = (float)local_a8._4_4_ + bb.Min.y;
  local_a8._0_8_ = pIVar17;
  local_d8 = (ImDrawList *)CONCAT44(local_d8._4_4_,iVar20);
  local_cc = uVar21;
  if ((uVar5 & 0xc0) == 0) {
    fVar28 = tab_bar->ScrollingRectMinX;
    if ((fVar28 <= bb.Min.x) && (bb.Max.x <= tab_bar->ScrollingRectMaxX)) goto LAB_0021336d;
    fStack_8c = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar28 <= bb.Min.x) & (uint)fVar28 |
                      (uint)bb.Min.x & -(uint)(fVar28 <= bb.Min.x));
    _held = tab_bar->ScrollingRectMaxX;
    local_bc = bb.Max.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    local_d0 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
LAB_0021336d:
    local_d0 = 0;
  }
  pIVar10 = local_b0;
  _hovered = bb.Max.x - bb.Min.x;
  fStack_8c = bb.Max.y - bb.Min.y;
  IVar24 = (local_b0->DC).CursorMaxPos;
  ItemSize((ImVec2 *)&hovered,(ctx->Style).FramePadding.y);
  (pIVar10->DC).CursorMaxPos = IVar24;
  _Var12 = ItemAdd(&bb,id,(ImRect *)0x0,0);
  IVar24 = local_b8;
  if (!_Var12) {
    if ((char)local_d0 != '\0') {
      PopClipRect();
    }
    (local_b0->DC).CursorPos = IVar24;
    return is_contents_visible;
  }
  uVar21 = (flags_00 >> 0x11 & 0x10) + 0x1010;
  if (ctx->DragDropActive == true) {
    _Var12 = ImGuiPayload::IsDataType(&ctx->DragDropPayload,"_IMWINDOW");
    if (!_Var12) {
      uVar21 = uVar21 | 0x200;
    }
  }
  bVar13 = ButtonBehavior(&bb,id,&hovered,&held,uVar21);
  pIVar9 = local_c8;
  if ((flags_00 >> 0x15 & 1) == 0 && bVar13) {
    tab_bar->NextSelectedTabId = id;
  }
  if ((ctx->ActiveId == id & local_c8 != (ImGuiWindow *)0x0 & held) == 1) {
    pIVar17 = (ImGuiTabItem *)local_a8._0_8_;
    if (ctx->ActiveIdIsJustActivated == true) {
      ctx->ActiveIdWindow = (ImGuiWindow_conflict *)local_c8;
    }
LAB_002134f0:
    pIVar6 = pIVar9->DockNode;
    if (((pIVar6 == (ImGuiDockNode *)0x0) || (pIVar6->ParentNode != (ImGuiDockNode *)0x0)) ||
       ((pIVar6->MergedFlags & 0x400U) != 0)) goto LAB_00213537;
    if ((held != true) || ((pIVar6->Windows).Size != 1)) goto LAB_0021353b;
    _Var12 = IsMouseDragging(0,0.0);
    if (!_Var12) goto LAB_00213537;
    StartMouseMovingWindow((ImGuiWindow_conflict *)pIVar9);
  }
  else {
    if (ctx->ActiveId != id) {
      SetItemAllowOverlap();
    }
    pIVar17 = (ImGuiTabItem *)local_a8._0_8_;
    if (pIVar9 != (ImGuiWindow *)0x0) goto LAB_002134f0;
LAB_00213537:
LAB_0021353b:
    if ((((held & 1U) != 0) && (iVar3 <= (int)local_d8._0_4_)) &&
       (_Var12 = IsMouseDragging(0,-1.0), _Var12)) {
      if (ctx->DragDropActive != false) goto LAB_00213581;
      if ((local_c8 == (ImGuiWindow *)0x0) && ((tab_bar->Flags & 1U) == 0)) goto LAB_00213848;
      fVar28 = (ctx->IO).MouseDelta.x;
      if (0.0 <= fVar28) {
LAB_00213787:
        if (0.0 < fVar28) {
          fVar22 = (ctx->IO).MousePos.x;
          if (bb.Max.x < fVar22) {
            fVar22 = fVar22 - bb.Max.x;
            bVar8 = true;
            bVar7 = false;
            goto LAB_002137c5;
          }
        }
LAB_00213581:
        bVar7 = false;
        bVar8 = false;
        fVar28 = 0.0;
      }
      else {
        fVar22 = (ctx->IO).MousePos.x;
        if (bb.Min.x <= fVar22) goto LAB_00213787;
        fVar22 = bb.Min.x - fVar22;
        bVar7 = true;
        bVar8 = false;
LAB_002137c5:
        local_d8 = (ImDrawList *)CONCAT44(local_d8._4_4_,fVar22);
        TabBarQueueReorderFromMousePos(tab_bar,pIVar17,(ctx->IO).MousePos);
        fVar28 = local_d8._0_4_;
      }
      if ((local_c8 != (ImGuiWindow *)0x0) && ((local_c8->Flags & 4) == 0)) {
        if ((ctx->DragDropActive != true) || ((ctx->DragDropPayload).SourceId != id)) {
          fVar22 = ctx->FontSize;
          fVar23 = (ABS((ctx->IO).MouseDragMaxDistanceAbs[0].x) - (fVar22 + fVar22)) * 0.2;
          fVar29 = fVar22 * 4.0;
          if (fVar23 <= fVar22 * 4.0) {
            fVar29 = fVar23;
          }
          fVar27 = (ctx->IO).MousePos.y;
          fVar26 = bb.Min.y - fVar27;
          fVar27 = fVar27 - bb.Max.y;
          fVar29 = fVar22 * 1.5 + (float)(~-(uint)(fVar23 < 0.0) & (uint)fVar29);
          uVar21 = -(uint)(fVar27 <= fVar26);
          if (fVar22 * 2.2 < fVar28) {
            local_d8 = (ImDrawList *)CONCAT44(local_d8._4_4_,fVar29);
            if (bVar7) {
              iVar14 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar17);
              fVar29 = local_d8._0_4_;
              if (iVar14 == 0) goto LAB_002137e4;
            }
            if (bVar8) {
              iVar14 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar17);
              fVar29 = local_d8._0_4_;
              if (iVar14 == (tab_bar->Tabs).Size + -1) goto LAB_002137e4;
            }
          }
          if ((float)(~uVar21 & (uint)fVar27 | (uint)fVar26 & uVar21) < fVar29) goto LAB_00213848;
        }
LAB_002137e4:
        pIVar9 = local_c8;
        DockContextQueueUndockWindow(ctx,(ImGuiWindow_conflict *)local_c8);
        ctx->MovingWindow = (ImGuiWindow_conflict *)pIVar9;
        SetActiveID(pIVar9->MoveId,(ImGuiWindow_conflict *)pIVar9);
        IVar24 = ctx->MovingWindow->Pos;
        IVar25.x = (ctx->ActiveIdClickOffset).x - (IVar24.x - bb.Min.x);
        IVar25.y = (ctx->ActiveIdClickOffset).y - (IVar24.y - bb.Min.y);
        ctx->ActiveIdClickOffset = IVar25;
        ctx->ActiveIdNoClearOnFocusLoss = true;
        SetActiveIdUsingNavAndKeys();
      }
    }
  }
LAB_00213848:
  IVar24 = local_b8;
  local_d8 = local_b0->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (is_contents_visible == false) {
      idx = (uint)((local_cc >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_cc >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(local_d8,&bb,flags_00,col);
  RenderNavHighlight(&bb,id,1);
  _Var12 = IsItemHovered(0x20);
  if (_Var12) {
    _Var12 = IsMouseClicked(1,false);
    if (_Var12) {
      uVar21 = flags_00 >> 0x15 & 1;
    }
    else {
      _Var12 = IsMouseReleased(1);
      if (!_Var12) goto LAB_00213919;
      uVar21 = flags_00 & 0x200000;
    }
    if (uVar21 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_00213919:
  uVar21 = tab_bar->Flags;
  if (local_88 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
  }
  TabItemLabelAndCloseButton
            (local_d8,&bb,uVar21 >> 1 & 4 | flags_00,tab_bar->FramePadding,local_80,id,
             close_button_id,is_contents_visible,&just_closed,&text_clipped);
  if ((local_88 != (bool *)0x0) && (just_closed != false)) {
    *local_88 = false;
    TabBarCloseTab(tab_bar,(ImGuiTabItem *)local_a8._0_8_);
  }
  if ((local_c8 != (ImGuiWindow *)0x0) &&
     ((hovered != false || (ctx->HoveredId == close_button_id)))) {
    pIVar1 = &(ctx->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
  }
  if ((char)local_d0 != '\0') {
    PopClipRect();
  }
  (local_b0->DC).CursorPos = IVar24;
  if (((((text_clipped == true) && (ctx->HoveredId == id)) && (held == false)) &&
      ((ctx->TooltipSlowDelay <= ctx->HoveredIdNotActiveTimer &&
        ctx->HoveredIdNotActiveTimer != ctx->TooltipSlowDelay &&
       (_Var12 = IsItemHovered(0), pcVar11 = local_80, _Var12)))) &&
     (((tab_bar->Flags & 0x20) == 0 && ((*(byte *)(local_a8._0_8_ + 4) & 0x10) == 0)))) {
    pcVar19 = FindRenderedTextEnd(local_80,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar19 - (int)pcVar11),pcVar11);
  }
  if (((flags_00 >> 0x15 & 1) != 0) &&
     (is_contents_visible = bVar13, tab_bar->SelectedTabId == *(ImGuiID *)local_a8._0_8_)) {
    __assert_fail("!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0x2006,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                 );
  }
  return is_contents_visible;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags, ImGuiWindow* docked_window)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label, docked_window);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    if (p_open && !*p_open)
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;
    tab->Window = docked_window;

    // Append name with zero-terminator
    // (regular tabs are permitted in a DockNode tab bar, but window tabs not permitted in a non-DockNode tab bar)
    if (tab->Window != NULL)
    {
        IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_DockNode);
        tab->NameOffset = -1;
    }
    else
    {
        IM_ASSERT(tab->Window == NULL);
        tab->NameOffset = (ImS32)tab_bar->TabsNames.size();
        tab_bar->TabsNames.append(label, label + strlen(label) + 1); // Append name _with_ the zero-terminator.
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing && docked_window == NULL)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive && !g.DragDropPayload.IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW)) // FIXME: May be an opt-in property of the payload to disable this
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;

    // Transfer active id window so the active id is not owned by the dock host (as StartMouseMovingWindow()
    // will only do it on the drag). This allows FocusWindow() to be more conservative in how it clears active id.
    if (held && docked_window && g.ActiveId == id && g.ActiveIdIsJustActivated)
        g.ActiveIdWindow = docked_window;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop a single floating window node moves it
    ImGuiDockNode* node = docked_window ? docked_window->DockNode : NULL;
    const bool single_floating_window_node = node && node->IsFloatingNode() && (node->Windows.Size == 1);
    if (held && single_floating_window_node && IsMouseDragging(0, 0.0f))
    {
        // Move
        StartMouseMovingWindow(docked_window);
    }
    else if (held && !tab_appearing && IsMouseDragging(0))
    {
        // Drag and drop: re-order tabs
        int drag_dir = 0;
        float drag_distance_from_edge_x = 0.0f;
        if (!g.DragDropActive && ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (docked_window != NULL)))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                drag_dir = -1;
                drag_distance_from_edge_x = bb.Min.x - g.IO.MousePos.x;
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                drag_dir = +1;
                drag_distance_from_edge_x = g.IO.MousePos.x - bb.Max.x;
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
        }

        // Extract a Dockable window out of it's tab bar
        if (docked_window != NULL && !(docked_window->Flags & ImGuiWindowFlags_NoMove))
        {
            // We use a variable threshold to distinguish dragging tabs within a tab bar and extracting them out of the tab bar
            bool undocking_tab = (g.DragDropActive && g.DragDropPayload.SourceId == id);
            if (!undocking_tab) //&& (!g.IO.ConfigDockingWithShift || g.IO.KeyShift)
            {
                float threshold_base = g.FontSize;
                float threshold_x = (threshold_base * 2.2f);
                float threshold_y = (threshold_base * 1.5f) + ImClamp((ImFabs(g.IO.MouseDragMaxDistanceAbs[0].x) - threshold_base * 2.0f) * 0.20f, 0.0f, threshold_base * 4.0f);
                //GetForegroundDrawList()->AddRect(ImVec2(bb.Min.x - threshold_x, bb.Min.y - threshold_y), ImVec2(bb.Max.x + threshold_x, bb.Max.y + threshold_y), IM_COL32_WHITE); // [DEBUG]

                float distance_from_edge_y = ImMax(bb.Min.y - g.IO.MousePos.y, g.IO.MousePos.y - bb.Max.y);
                if (distance_from_edge_y >= threshold_y)
                    undocking_tab = true;
                if (drag_distance_from_edge_x > threshold_x)
                    if ((drag_dir < 0 && tab_bar->GetTabOrder(tab) == 0) || (drag_dir > 0 && tab_bar->GetTabOrder(tab) == tab_bar->Tabs.Size - 1))
                        undocking_tab = true;
            }

            if (undocking_tab)
            {
                // Undock
                // FIXME: refactor to share more code with e.g. StartMouseMovingWindow
                DockContextQueueUndockWindow(&g, docked_window);
                g.MovingWindow = docked_window;
                SetActiveID(g.MovingWindow->MoveId, g.MovingWindow);
                g.ActiveIdClickOffset -= g.MovingWindow->Pos - bb.Min;
                g.ActiveIdNoClearOnFocusLoss = true;
                SetActiveIdUsingNavAndKeys();
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Forward Hovered state so IsItemHovered() after Begin() can work (even though we are technically hovering our parent)
    // That state is copied to window->DockTabItemStatusFlags by our caller.
    if (docked_window && (hovered || g.HoveredId == close_button_id))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip
    // (Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer-> seems ok)
    // (We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar, which g.HoveredId ignores)
    // FIXME: This is a mess.
    // FIXME: We may want disabled tab to still display the tooltip?
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}